

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O1

void * worker_thread_test_evict_get(void *arg)

{
  long lVar1;
  ulong local_30;
  unsigned_long_long n;
  char vbuf;
  
  local_30 = (ulong)*arg;
  do {
    if (keep_running == 0) {
      return (void *)0x0;
    }
    lVar1 = vmemcache_get(*(undefined8 *)((long)arg + 8),&local_30,8,(long)&n + 7,1,0,0);
  } while (lVar1 == 1);
  return (void *)0x0;
}

Assistant:

static void *
worker_thread_test_evict_get(void *arg)
{
	struct context *ctx = arg;
	unsigned long long n = ctx->thread_number;

	char vbuf;

	while (__atomic_load_n(&keep_running, __ATOMIC_SEQ_CST) &&
		vmemcache_get(ctx->cache, &n, sizeof(n),
				&vbuf, sizeof(vbuf), 0, NULL) == sizeof(vbuf))
		;

	return NULL;
}